

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int checkTreePage(IntegrityCk *pCheck,Pgno iPage,i64 *piMinKey,i64 maxKey)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  char *pcVar8;
  BtShared *pBt;
  u8 *puVar9;
  bool bVar10;
  uint uVar11;
  bool bVar12;
  Pgno PVar13;
  int iVar14;
  ushort uVar15;
  u16 uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  ushort *puVar25;
  long lVar26;
  ulong uVar27;
  char *zFormat;
  ulong uVar28;
  uint *puVar29;
  uint uVar30;
  uint *puVar31;
  int iVar32;
  uint uVar33;
  MemPage *pPage_00;
  long in_FS_OFFSET;
  MemPage *pPage;
  undefined1 local_68 [20];
  ushort uStack_54;
  ushort uStack_52;
  MemPage *local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (MemPage *)0x0;
  pcVar8 = pCheck->zPfx;
  PVar13 = pCheck->v1;
  iVar14 = pCheck->v2;
  local_40 = maxKey;
  checkProgress(pCheck);
  iVar32 = -1;
  if (pCheck->mxErr == 0) {
LAB_0015c51d:
    pPage_00 = local_48;
    if (local_48 != (MemPage *)0x0) goto LAB_0015c52a;
  }
  else {
    iVar32 = 0;
    if (iPage == 0) goto LAB_0015c549;
    pBt = pCheck->pBt;
    uVar33 = pBt->usableSize;
    iVar17 = checkRef(pCheck,iPage);
    iVar32 = 0;
    if (iVar17 != 0) goto LAB_0015c549;
    pCheck->zPfx = "Tree %u page %u: ";
    pCheck->v1 = iPage;
    uVar18 = btreeGetPage(pBt,iPage,&local_48,0);
    pPage_00 = local_48;
    if (uVar18 != 0) {
      checkAppendMsg(pCheck,"unable to get the page. error code=%d",(ulong)uVar18);
      iVar32 = -1;
      if (uVar18 == 0xc0a) {
        pCheck->rc = 7;
      }
      goto LAB_0015c51d;
    }
    uVar1 = local_48->isInit;
    local_48->isInit = '\0';
    uVar18 = btreeInitPage(local_48);
    iVar32 = -1;
    if (uVar18 != 0) {
      zFormat = "btreeInitPage() returns error code %d";
LAB_0015c50c:
      checkAppendMsg(pCheck,zFormat,(ulong)uVar18);
      goto LAB_0015c51d;
    }
    uVar18 = btreeComputeFreeSpace(pPage_00);
    if (uVar18 != 0) {
      zFormat = "free space corruption";
      goto LAB_0015c50c;
    }
    puVar9 = pPage_00->aData;
    uVar28 = (ulong)pPage_00->hdrOffset;
    pCheck->zPfx = "Tree %u page %u cell %u: ";
    bVar2 = puVar9[uVar28 + 5];
    bVar3 = puVar9[uVar28 + 6];
    bVar4 = puVar9[uVar28 + 3];
    bVar5 = puVar9[uVar28 + 4];
    uVar18 = (uint)bVar4 * 0x100 + (uint)bVar5;
    bVar6 = pPage_00->leaf;
    if ((bVar6 != 0) || (pPage_00->intKey == '\0')) {
      pCheck->nRow = pCheck->nRow + (ulong)uVar18;
    }
    lVar24 = uVar28 - (uint)bVar6 * 4;
    if (bVar6 == 0) {
      uVar30 = *(uint *)(puVar9 + uVar28 + 8);
      uVar30 = uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8 | uVar30 << 0x18;
      if (pBt->autoVacuum != '\0') {
        pCheck->zPfx = "Tree %u page %u right child: ";
        checkPtrmap(pCheck,uVar30,'\x05',iPage);
      }
      iVar32 = checkTreePage(pCheck,uVar30,&local_40,maxKey);
      bVar10 = false;
      puVar31 = (uint *)0x0;
    }
    else {
      puVar31 = pCheck->heap;
      *puVar31 = 0;
      iVar32 = -1;
      bVar10 = true;
    }
    uVar30 = ((uint)bVar2 * 0x100 + (uint)bVar3) - 1 & 0xffff;
    if (uVar18 == 0) {
      *piMinKey = local_40;
      pCheck->zPfx = (char *)0x0;
LAB_0015c9cb:
      if (0 < pCheck->mxErr) {
        if (pPage_00->leaf == '\0') {
          puVar31 = pCheck->heap;
          *puVar31 = 0;
          if (uVar18 != 0) {
            uVar20 = (ulong)CONCAT11(bVar4,bVar5);
            do {
              uVar15 = *(ushort *)(puVar9 + uVar20 * 2 + lVar24 + 10) << 8 |
                       *(ushort *)(puVar9 + uVar20 * 2 + lVar24 + 10) >> 8;
              uVar16 = (*pPage_00->xCellSize)(pPage_00,puVar9 + uVar15);
              uVar18 = *puVar31 + 1;
              *puVar31 = uVar18;
              puVar31[uVar18] = ((uint)uVar15 + (uint)uVar16) - 1 | (uint)uVar15 << 0x10;
              uVar21 = (ulong)uVar18;
              if (1 < uVar18) {
                do {
                  uVar27 = uVar21 >> 1;
                  uVar18 = puVar31[uVar27];
                  if (uVar18 <= puVar31[uVar21]) break;
                  puVar31[uVar27] = puVar31[uVar21];
                  puVar31[uVar21] = uVar18;
                  uVar18 = (uint)uVar21;
                  uVar21 = uVar27;
                } while (3 < uVar18);
              }
              bVar10 = 1 < (long)uVar20;
              uVar20 = uVar20 - 1;
            } while (bVar10);
          }
        }
        for (uVar15 = *(ushort *)(puVar9 + uVar28 + 1) << 8 | *(ushort *)(puVar9 + uVar28 + 1) >> 8;
            uVar15 != 0;
            uVar15 = *(ushort *)(puVar9 + uVar15) << 8 | *(ushort *)(puVar9 + uVar15) >> 8) {
          uVar7 = *(ushort *)(puVar9 + (ulong)uVar15 + 2);
          uVar18 = *puVar31 + 1;
          *puVar31 = uVar18;
          puVar31[uVar18] =
               ((uint)(ushort)(uVar7 << 8 | uVar7 >> 8) + (uint)uVar15) - 1 | (uint)uVar15 << 0x10;
          uVar20 = (ulong)uVar18;
          if (1 < uVar18) {
            do {
              uVar21 = uVar20 >> 1;
              uVar18 = puVar31[uVar21];
              if (uVar18 <= puVar31[uVar20]) break;
              puVar31[uVar21] = puVar31[uVar20];
              puVar31[uVar20] = uVar18;
              uVar18 = (uint)uVar20;
              uVar20 = uVar21;
            } while (3 < uVar18);
          }
        }
        iVar17 = 0;
        uVar18 = *puVar31;
        while (uVar18 != 0) {
          uVar11 = puVar31[1];
          puVar31[1] = puVar31[uVar18];
          puVar31[uVar18] = 0xffffffff;
          uVar19 = uVar18 - 1;
          *puVar31 = uVar19;
          if (2 < uVar18) {
            uVar18 = puVar31[1];
            uVar20 = (ulong)((puVar31[3] < puVar31[2]) + 2);
            uVar23 = puVar31[uVar20];
            if (uVar23 <= uVar18) {
              puVar29 = puVar31 + uVar20;
              uVar21 = 1;
              do {
                uVar27 = uVar20;
                puVar31[uVar21] = uVar23;
                *puVar29 = uVar18;
                uVar23 = (int)uVar27 * 2;
                uVar19 = *puVar31;
                if (uVar19 < uVar23) break;
                uVar20 = (ulong)(uVar23 | 1);
                if (puVar31[uVar23] <= puVar31[uVar20]) {
                  uVar20 = (ulong)uVar23;
                }
                puVar29 = puVar31 + uVar20;
                uVar23 = *puVar29;
                uVar21 = uVar27;
              } while (uVar23 <= uVar18);
            }
          }
          uVar18 = uVar11 >> 0x10;
          if (uVar18 <= (uVar30 & 0xffff)) {
            checkAppendMsg(pCheck,"Multiple uses for byte %u of page %u",uVar18,(ulong)iPage);
            if (*puVar31 != 0) goto LAB_0015c51d;
            break;
          }
          iVar17 = iVar17 + ~(uVar30 & 0xffff) + uVar18;
          uVar30 = uVar11;
          uVar18 = uVar19;
        }
        uVar33 = iVar17 + uVar33 + (~uVar30 | 0xffff0000);
        if (uVar33 != puVar9[uVar28 + 7]) {
          checkAppendMsg(pCheck,"Fragmentation of %u bytes reported as %u on page %u",(ulong)uVar33,
                         (ulong)puVar9[uVar28 + 7],(ulong)iPage);
        }
      }
      goto LAB_0015c51d;
    }
    puVar25 = (ushort *)(puVar9 + (int)((int)lVar24 + uVar18 * 2 + 10));
    bVar12 = true;
    uVar11 = uVar18;
    do {
      uVar11 = uVar11 - 1;
      if (pCheck->mxErr == 0) break;
      stack0xffffffffffffffa8 = &DAT_aaaaaaaaaaaaaaaa;
      local_68._0_4_ = 0xaaaaaaaa;
      local_68._4_4_ = 0xaaaaaaaa;
      local_68._8_4_ = 0xaaaaaaaa;
      local_68._12_4_ = 0xaaaaaaaa;
      pCheck->v2 = uVar11;
      uVar15 = *puVar25 << 8 | *puVar25 >> 8;
      uVar19 = (uint)uVar15;
      if (uVar33 - 4 < (uint)uVar15 || uVar15 <= uVar30) {
        bVar12 = false;
        checkAppendMsg(pCheck,"Offset %u out of range %u..%u",(ulong)uVar19,(ulong)(uVar30 + 1));
      }
      else {
        puVar29 = (uint *)(puVar9 + uVar19);
        (*pPage_00->xParseCell)(pPage_00,(u8 *)puVar29,(CellInfo *)local_68);
        if (uVar33 < uStack_52 + uVar19) {
          bVar12 = false;
          checkAppendMsg(pCheck,"Extends off end of page");
        }
        else {
          if (pPage_00->intKey != '\0') {
            lVar26 = CONCAT44(local_68._4_4_,local_68._0_4_);
            if (bVar10) {
              if (local_40 < lVar26) {
LAB_0015c7e6:
                checkAppendMsg(pCheck,"Rowid %lld out of order");
                lVar26 = CONCAT44(local_68._4_4_,local_68._0_4_);
              }
            }
            else if (local_40 <= lVar26) goto LAB_0015c7e6;
            bVar10 = false;
            local_40 = lVar26;
          }
          if ((uint)uStack_54 < (uint)local_68._16_4_) {
            iVar17 = local_68._16_4_ + (uVar33 - 5);
            uVar22 = (uint)uStack_54;
            uVar23 = *(uint *)((long)puVar29 + (((ulong)stack0xffffffffffffffa8 >> 0x30) - 4));
            uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                     uVar23 << 0x18;
            if (pBt->autoVacuum != '\0') {
              checkPtrmap(pCheck,uVar23,'\x03',iPage);
            }
            checkList(pCheck,0,uVar23,(iVar17 - uVar22) / (uVar33 - 4));
          }
          if (pPage_00->leaf == '\0') {
            uVar19 = *puVar29;
            uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                     uVar19 << 0x18;
            if (pBt->autoVacuum != '\0') {
              checkPtrmap(pCheck,uVar19,'\x05',iPage);
            }
            iVar17 = checkTreePage(pCheck,uVar19,&local_40,local_40);
            if (iVar17 == iVar32) {
              bVar10 = false;
            }
            else {
              bVar10 = false;
              checkAppendMsg(pCheck,"Child page depth differs");
              iVar32 = iVar17;
            }
          }
          else {
            uVar23 = *puVar31 + 1;
            *puVar31 = uVar23;
            puVar31[uVar23] = ((uint)uVar15 + (uint)uStack_52) - 1 | uVar19 << 0x10;
            uVar20 = (ulong)uVar23;
            if (1 < uVar23) {
              do {
                uVar21 = uVar20 >> 1;
                uVar19 = puVar31[uVar21];
                if (uVar19 <= puVar31[uVar20]) break;
                puVar31[uVar21] = puVar31[uVar20];
                puVar31[uVar20] = uVar19;
                uVar19 = (uint)uVar20;
                uVar20 = uVar21;
              } while (3 < uVar19);
            }
          }
        }
      }
      puVar25 = puVar25 + -1;
    } while (0 < (int)uVar11);
    *piMinKey = local_40;
    pCheck->zPfx = (char *)0x0;
    if (bVar12) goto LAB_0015c9cb;
    pPage_00->isInit = uVar1;
LAB_0015c52a:
    sqlite3PagerUnrefNotNull(pPage_00->pDbPage);
  }
  pCheck->zPfx = pcVar8;
  pCheck->v1 = PVar13;
  pCheck->v2 = iVar14;
  iVar32 = iVar32 + 1;
LAB_0015c549:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar32;
  }
  __stack_chk_fail();
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  Pgno iPage,           /* Page number of the page to check */
  i64 *piMinKey,        /* Write minimum integer primary key here */
  i64 maxKey            /* Error if integer primary key greater than this */
){
  MemPage *pPage = 0;      /* The page being analyzed */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subroutine call */
  int depth = -1, d2;      /* Depth of a subtree */
  int pgno;                /* Page number */
  int nFrag;               /* Number of fragmented bytes on the page */
  int hdr;                 /* Offset to the page header */
  int cellStart;           /* Offset to the start of the cell pointer array */
  int nCell;               /* Number of cells */
  int doCoverageCheck = 1; /* True if cell coverage checking should be done */
  int keyCanBeEqual = 1;   /* True if IPK can be equal to maxKey
                           ** False if IPK must be strictly less than maxKey */
  u8 *data;                /* Page content */
  u8 *pCell;               /* Cell content */
  u8 *pCellIdx;            /* Next element of the cell pointer array */
  BtShared *pBt;           /* The BtShared object that owns pPage */
  u32 pc;                  /* Address of a cell */
  u32 usableSize;          /* Usable size of the page */
  u32 contentOffset;       /* Offset to the start of the cell content area */
  u32 *heap = 0;           /* Min-heap used for checking cell coverage */
  u32 x, prev = 0;         /* Next and previous entry on the min-heap */
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;
  u8 savedIsInit = 0;

  /* Check that the page exists
  */
  checkProgress(pCheck);
  if( pCheck->mxErr==0 ) goto end_of_check;
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Tree %u page %u: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    if( rc==SQLITE_IOERR_NOMEM ) pCheck->rc = SQLITE_NOMEM;
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  savedIsInit = pPage->isInit;
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    goto end_of_check;
  }
  if( (rc = btreeComputeFreeSpace(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );
    checkAppendMsg(pCheck, "free space corruption", rc);
    goto end_of_check;
  }
  data = pPage->aData;
  hdr = pPage->hdrOffset;

  /* Set up for cell analysis */
  pCheck->zPfx = "Tree %u page %u cell %u: ";
  contentOffset = get2byteNotZero(&data[hdr+5]);
  assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */

  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  nCell = get2byte(&data[hdr+3]);
  assert( pPage->nCell==nCell );
  if( pPage->leaf || pPage->intKey==0 ){
    pCheck->nRow += nCell;
  }

  /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
  ** immediately follows the b-tree page header. */
  cellStart = hdr + 12 - 4*pPage->leaf;
  assert( pPage->aCellIdx==&data[cellStart] );
  pCellIdx = &data[cellStart + 2*(nCell-1)];

  if( !pPage->leaf ){
    /* Analyze the right-child page of internal pages */
    pgno = get4byte(&data[hdr+8]);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      pCheck->zPfx = "Tree %u page %u right child: ";
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    depth = checkTreePage(pCheck, pgno, &maxKey, maxKey);
    keyCanBeEqual = 0;
  }else{
    /* For leaf pages, the coverage check will occur in the same loop
    ** as the other cell checks, so initialize the heap.  */
    heap = pCheck->heap;
    heap[0] = 0;
  }

  /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
  ** integer offsets to the cell contents. */
  for(i=nCell-1; i>=0 && pCheck->mxErr; i--){
    CellInfo info;

    /* Check cell size */
    pCheck->v2 = i;
    assert( pCellIdx==&data[cellStart + i*2] );
    pc = get2byteAligned(pCellIdx);
    pCellIdx -= 2;
    if( pc<contentOffset || pc>usableSize-4 ){
      checkAppendMsg(pCheck, "Offset %u out of range %u..%u",
                             pc, contentOffset, usableSize-4);
      doCoverageCheck = 0;
      continue;
    }
    pCell = &data[pc];
    pPage->xParseCell(pPage, pCell, &info);
    if( pc+info.nSize>usableSize ){
      checkAppendMsg(pCheck, "Extends off end of page");
      doCoverageCheck = 0;
      continue;
    }

    /* Check for integer primary key out of range */
    if( pPage->intKey ){
      if( keyCanBeEqual ? (info.nKey > maxKey) : (info.nKey >= maxKey) ){
        checkAppendMsg(pCheck, "Rowid %lld out of order", info.nKey);
      }
      maxKey = info.nKey;
      keyCanBeEqual = 0;     /* Only the first key on the page may ==maxKey */
    }

    /* Check the content overflow list */
    if( info.nPayload>info.nLocal ){
      u32 nPage;       /* Number of pages on the overflow chain */
      Pgno pgnoOvfl;   /* First page of the overflow chain */
      assert( pc + info.nSize - 4 <= usableSize );
      nPage = (info.nPayload - info.nLocal + usableSize - 5)/(usableSize - 4);
      pgnoOvfl = get4byte(&pCell[info.nSize - 4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    if( !pPage->leaf ){
      /* Check sanity of left child page for internal pages */
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &maxKey, maxKey);
      keyCanBeEqual = 0;
      if( d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
        depth = d2;
      }
    }else{
      /* Populate the coverage-checking heap for leaf pages */
      btreeHeapInsert(heap, (pc<<16)|(pc+info.nSize-1));
    }
  }
  *piMinKey = maxKey;

  /* Check for complete coverage of the page
  */
  pCheck->zPfx = 0;
  if( doCoverageCheck && pCheck->mxErr>0 ){
    /* For leaf pages, the min-heap has already been initialized and the
    ** cells have already been inserted.  But for internal pages, that has
    ** not yet been done, so do it now */
    if( !pPage->leaf ){
      heap = pCheck->heap;
      heap[0] = 0;
      for(i=nCell-1; i>=0; i--){
        u32 size;
        pc = get2byteAligned(&data[cellStart+i*2]);
        size = pPage->xCellSize(pPage, &data[pc]);
        btreeHeapInsert(heap, (pc<<16)|(pc+size-1));
      }
    }
    assert( heap!=0 );
    /* Add the freeblocks to the min-heap
    **
    ** EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page.
    */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( (u32)i<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      size = get2byte(&data[i+2]);
      assert( (u32)(i+size)<=usableSize ); /* due to btreeComputeFreeSpace() */
      btreeHeapInsert(heap, (((u32)i)<<16)|(i+size-1));
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );     /* Enforced by btreeComputeFreeSpace() */
      assert( (u32)j<=usableSize-4 ); /* Enforced by btreeComputeFreeSpace() */
      i = j;
    }
    /* Analyze the min-heap looking for overlap between cells and/or
    ** freeblocks, and counting the number of untracked bytes in nFrag.
    **
    ** Each min-heap entry is of the form:    (start_address<<16)|end_address.
    ** There is an implied first entry the covers the page header, the cell
    ** pointer index, and the gap between the cell pointer index and the start
    ** of cell content.
    **
    ** The loop below pulls entries from the min-heap in order and compares
    ** the start_address against the previous end_address.  If there is an
    ** overlap, that means bytes are used multiple times.  If there is a gap,
    ** that gap is added to the fragmentation count.
    */
    nFrag = 0;
    prev = contentOffset - 1;   /* Implied first min-heap entry */
    while( btreeHeapPull(heap,&x) ){
      if( (prev&0xffff)>=(x>>16) ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %u of page %u", x>>16, iPage);
        break;
      }else{
        nFrag += (x>>16) - (prev&0xffff) - 1;
        prev = x;
      }
    }
    nFrag += usableSize - (prev&0xffff) - 1;
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( heap[0]==0 && nFrag!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %u bytes reported as %u on page %u",
          nFrag, data[hdr+7], iPage);
    }
  }

end_of_check:
  if( !doCoverageCheck ) pPage->isInit = savedIsInit;
  releasePage(pPage);
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}